

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-capability.c++
# Opt level: O3

Client * __thiscall
capnp::DynamicCapability::Client::upcast
          (Client *__return_storage_ptr__,Client *this,InterfaceSchema requestedSchema)

{
  DebugExpression<bool> _kjCondition;
  Fault f;
  ClientHook *pCStack_20;
  
  _kjCondition.value = InterfaceSchema::extends(&this->schema,requestedSchema);
  if (_kjCondition.value) {
    (*((this->super_Client).hook.ptr)->_vptr_ClientHook[4])(&f);
    (__return_storage_ptr__->super_Client).hook.disposer = (Disposer *)f.exception;
    (__return_storage_ptr__->super_Client).hook.ptr = pCStack_20;
    (__return_storage_ptr__->schema).super_Schema.raw =
         (RawBrandedSchema *)requestedSchema.super_Schema.raw;
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[32]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-capability.c++"
             ,0x1e,FAILED,"schema.extends(requestedSchema)",
             "_kjCondition,\"Can\'t upcast to non-superclass.\"",&_kjCondition,
             (char (*) [32])"Can\'t upcast to non-superclass.");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

DynamicCapability::Client DynamicCapability::Client::upcast(InterfaceSchema requestedSchema) {
  KJ_REQUIRE(schema.extends(requestedSchema), "Can't upcast to non-superclass.") {}
  return DynamicCapability::Client(requestedSchema, hook->addRef());
}